

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketClient.cpp
# Opt level: O0

int __thiscall SocketClient::connect(SocketClient *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  char *__src;
  int *piVar3;
  element_type *this_00;
  ulong extraout_RAX;
  undefined4 in_register_00000034;
  shared_ptr<SocketClient> *args;
  bool bVar4;
  undefined1 local_d0 [8];
  SharedPtr loop;
  Error local_b8 [5];
  int local_a4;
  undefined1 local_a0 [4];
  int e;
  SharedPtr unixSocket;
  sockaddr_un addr_un;
  String *path_local;
  SocketClient *this_local;
  ulong uVar2;
  
  uVar1 = init(this,(EVP_PKEY_CTX *)0x4);
  uVar2 = (ulong)uVar1;
  if ((uVar1 & 1) == 0) {
    this_local._7_1_ = 0;
    goto LAB_00284dea;
  }
  memset((void *)((long)&unixSocket.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 2),0,0x6e);
  unixSocket.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._2_2_ =
       1;
  __src = String::constData((String *)CONCAT44(in_register_00000034,__fd));
  strncpy((char *)((long)&unixSocket.super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi + 4),__src,0x6c);
  std::enable_shared_from_this<SocketClient>::shared_from_this
            ((enable_shared_from_this<SocketClient> *)local_a0);
  do {
    local_a4 = ::connect(this->mFd,
                         (sockaddr *)
                         ((long)&unixSocket.
                                 super___shared_ptr<SocketClient,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi + 2),0x6e);
    bVar4 = false;
    if (local_a4 == -1) {
      piVar3 = __errno_location();
      bVar4 = *piVar3 == 4;
    }
  } while (bVar4);
  String::operator=(&this->mAddress,(String *)CONCAT44(in_register_00000034,__fd));
  if (local_a4 == 0) {
    this->mSocketState = Connected;
    Signal<std::function<void(std::shared_ptr<SocketClient>const&)>>::operator()
              ((Signal<std::function<void(std::shared_ptr<SocketClient>const&)>> *)
               &this->signalConnected,(shared_ptr<SocketClient> *)local_a0);
LAB_00284dc0:
    this_local._7_1_ = 1;
  }
  else {
    piVar3 = __errno_location();
    if (*piVar3 == 0x73) {
      EventLoop::eventLoop();
      bVar4 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_d0);
      if (bVar4) {
        this_00 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                  operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)local_d0);
        EventLoop::updateSocket(this_00,this->mFd,7);
        this->mWriteWait = true;
      }
      std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_d0);
      this->mSocketState = Connecting;
      goto LAB_00284dc0;
    }
    local_b8[0] = ConnectError;
    args = (shared_ptr<SocketClient> *)local_a0;
    Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>::operator()
              ((Signal<std::function<void(std::shared_ptr<SocketClient>const&,SocketClient::Error)>>
                *)&this->mSignalError,args,local_b8);
    close(this,(int)args);
    this_local._7_1_ = 0;
  }
  loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_ = 1;
  std::shared_ptr<SocketClient>::~shared_ptr((shared_ptr<SocketClient> *)local_a0);
  uVar2 = extraout_RAX;
LAB_00284dea:
  return (int)CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool SocketClient::connect(const String& path)
{
    if (!init(Unix))
        return false;

    union {
        sockaddr_un addr_un;
        sockaddr addr;
    };
    memset(&addr_un, '\0', sizeof(addr_un));
    addr_un.sun_family = AF_UNIX;
    strncpy(addr_un.sun_path, path.constData(), sizeof(addr_un.sun_path));

    SocketClient::SharedPtr unixSocket = shared_from_this();

    int e;
    eintrwrap(e, ::connect(mFd, &addr, sizeof(addr_un)));
    mAddress = path;
    if (e == 0) { // we're done
        mSocketState = Connected;

        signalConnected(unixSocket);
    } else {
        if (errno != EINPROGRESS) {
            // bad
            mSignalError(unixSocket, ConnectError);
            close();
            return false;
        }
        if (EventLoop::SharedPtr loop = EventLoop::eventLoop()) {
            loop->updateSocket(mFd, EventLoop::SocketRead|EventLoop::SocketWrite|EventLoop::SocketOneShot);
            mWriteWait = true;
        }
        mSocketState = Connecting;
    }
    return true;
}